

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocmds.c
# Opt level: O0

LispPTR * alloc_mdspage(short type)

{
  LispPTR LVar1;
  LispPTR *pLStack_18;
  LispPTR next_page;
  LispPTR *ptr;
  short type_local;
  
  if ((*MDS_free_page_word & 0xffff) == 0) {
    checkfor_storagefull(0);
    pLStack_18 = (LispPTR *)NativeAligned2FromLAddr(*Next_MDSpage_word << 8);
    Next_MDSpage = (DLword *)(pLStack_18 + -0x100);
    LVar1 = LPageFromNative(Next_MDSpage);
    *Next_MDSpage_word = LVar1;
    LVar1 = LAddrFromNative(pLStack_18);
    LVar1 = newpage(LVar1);
    newpage(LVar1 + 0x100);
  }
  else {
    pLStack_18 = NativeAligned4FromLPage(*MDS_free_page_word & 0xffff);
    if (((*pLStack_18 & 0xffff) == 0) ||
       ((*(ushort *)((ulong)(MDStypetbl + (*pLStack_18 >> 9)) ^ 2) & 0x7ff) == 1)) {
      *MDS_free_page_word = *pLStack_18 & 0xffff | 0xe0000;
    }
    else {
      error("alloc_mdspage: Bad Free Page Link");
    }
  }
  LVar1 = LPageFromNative(pLStack_18);
  Make_MDSentry((ulong)LVar1,type);
  return pLStack_18;
}

Assistant:

LispPTR *alloc_mdspage(short int type) {
  LispPTR *ptr; /* points Top 32 bit of the MDS page */
  LispPTR next_page;

  /* Next_Array=(DLword *)NativeAligned2FromLAddr(((*Next_Array_word)& 0xffff ) << 8); */

  if (LOLOC(*MDS_free_page_word) != NIL) {
    ptr = (LispPTR *)NativeAligned4FromLPage(LOLOC(*MDS_free_page_word));

    if (((next_page = LOLOC(*ptr)) != 0) && (GetTypeNumber((*ptr)) != TYPE_SMALLP))
      error("alloc_mdspage: Bad Free Page Link");
    else {
      *MDS_free_page_word = S_POSITIVE | next_page;
    }
  } else {
    /* I guess Next_MDSpage is redundant */
    checkfor_storagefull(NIL);
#ifdef BIGVM
    Next_MDSpage = (DLword *)NativeAligned2FromLAddr(((*Next_MDSpage_word)) << 8);
#else
    Next_MDSpage = (DLword *)NativeAligned2FromLAddr(((*Next_MDSpage_word) & 0xffff) << 8);
#endif
    ptr = (LispPTR *)Next_MDSpage;       /* Get Pointer to First Page */
    Next_MDSpage -= DLWORDSPER_PAGE * 2; /* decrement MDS count */
#ifdef BIGVM
    *Next_MDSpage_word = LPageFromNative(Next_MDSpage);
#else
    *Next_MDSpage_word = S_POSITIVE | LPageFromNative(Next_MDSpage);
#endif
    newpage(newpage(LAddrFromNative(ptr)) + DLWORDSPER_PAGE);
  }

  Make_MDSentry(LPageFromNative(ptr), type);
  return (ptr);
}